

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Dispatch_Engine::dump_type(Dispatch_Engine *this,Type_Info *type)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_38;
  Type_Info *local_18;
  Type_Info *type_local;
  Dispatch_Engine *this_local;
  
  local_18 = type;
  type_local = (Type_Info *)this;
  bVar1 = Type_Info::is_const(type);
  pcVar3 = "";
  if (bVar1) {
    pcVar3 = "const ";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  get_type_name_abi_cxx11_(&local_38,this,local_18);
  std::operator<<(poVar2,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void dump_type(const Type_Info &type) const { std::cout << (type.is_const() ? "const " : "") << get_type_name(type); }